

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

CoinsResult * __thiscall
wallet::AvailableCoins
          (CoinsResult *__return_storage_ptr__,wallet *this,CWallet *wallet,
          CCoinControl *coinControl,optional<CFeeRate> feerate,CoinFilterParams *params)

{
  _Rb_tree_header *p_Var1;
  CWalletTx *wtx;
  long lVar2;
  long lVar3;
  long lVar4;
  uchar *puVar5;
  COutput *pCVar6;
  COutPoint outpoint_00;
  optional<CFeeRate> feerate_00;
  char cVar7;
  undefined1 auVar8 [8];
  bool bVar9;
  bool bVar10;
  byte bVar11;
  bool can_grind_r;
  bool bVar12;
  bool bVar13;
  int depth;
  isminetype iVar14;
  int input_bytes;
  TxoutType TVar15;
  int iVar16;
  size_type sVar17;
  size_type sVar18;
  int64_t time;
  size_t sVar19;
  Chain *pCVar20;
  mapped_type *pmVar21;
  _Base_ptr p_Var22;
  bool bVar23;
  CTxOut *txout;
  long *plVar24;
  wallet *pwVar25;
  uint32_t uVar26;
  ulong uVar27;
  OutputType type;
  COutput *this_00;
  long in_FS_OFFSET;
  bool bVar28;
  Span<const_unsigned_char> vch;
  bool local_25c;
  int local_22c;
  int local_228;
  undefined4 local_220;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  script_solutions;
  undefined1 local_1e0 [8];
  vector<COutPoint,_std::allocator<COutPoint>_> outpoints;
  optional<CFeeRate> feerate_local;
  CScript script;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_158 [2];
  base_blob<160U> local_fc;
  uchar local_e8 [4];
  uchar auStack_e4 [4];
  uchar auStack_e0 [4];
  uchar auStack_dc [4];
  int local_d8;
  _Rb_tree_node_base local_c8;
  uint32_t local_a8;
  COutPoint outpoint;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> trusted_parents;
  
  plVar24 = feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._8_8_;
  feerate_local.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged =
       feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
       super__Optional_payload_base<CFeeRate>._M_payload._0_1_;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->total_amount = 0;
  (__return_storage_ptr__->total_effective_amount).super__Optional_base<long,_true,_true>._M_payload
  .super__Optional_payload_base<long>._M_payload._M_value = 0;
  (__return_storage_ptr__->total_effective_amount).super__Optional_base<long,_true,_true>._M_payload
  .super__Optional_payload_base<long>._M_engaged = true;
  feerate_local.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = (_Storage<CFeeRate,_true>)coinControl;
  bVar10 = CWallet::IsWalletFlagSet((CWallet *)this,1);
  if (bVar10) {
    if (wallet == (CWallet *)0x0) {
      bVar11 = 0;
LAB_0098b708:
      local_22c = 9999999;
      bVar10 = false;
      local_228 = 0;
      cVar7 = '\0';
      goto LAB_0098b718;
    }
    bVar11 = *(byte *)((long)&(wallet->mapTxSpends)._M_h._M_buckets + 3) ^ 1;
  }
  else {
    bVar11 = 1;
    if (wallet == (CWallet *)0x0) goto LAB_0098b708;
  }
  local_228 = (int)(wallet->mapTxSpends)._M_h._M_bucket_count;
  local_22c = *(int *)((long)&(wallet->mapTxSpends)._M_h._M_bucket_count + 4);
  cVar7 = (char)(wallet->m_best_block_time).super___atomic_base<long>._M_i;
  bVar10 = true;
LAB_0098b718:
  can_grind_r = CWallet::CanGrindR((CWallet *)this);
  outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header;
  trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  trusted_parents._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pwVar25 = this + 0x268;
  bVar23 = false;
  trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
switchD_0098bcf7_caseD_3:
  do {
    do {
      do {
        do {
          pwVar25 = *(wallet **)pwVar25;
          if (pwVar25 == (wallet *)0x0) {
switchD_0098bcf7_caseD_2:
            local_a8 = 0xffffffff;
            if (((undefined1  [16])
                 feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                 super__Optional_payload_base<CFeeRate> & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0) {
              pCVar20 = CWallet::chain((CWallet *)this);
              (*pCVar20->_vptr_Chain[0x17])(&script,pCVar20,&outpoints,&feerate_local);
              for (p_Var22 = (__return_storage_ptr__->coins)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_left; (_Rb_tree_header *)p_Var22 != p_Var1;
                  p_Var22 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var22)) {
                pCVar6 = (COutput *)p_Var22[1]._M_left;
                for (this_00 = (COutput *)p_Var22[1]._M_parent; this_00 != pCVar6;
                    this_00 = this_00 + 1) {
                  pmVar21 = std::
                            map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                            ::at((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                  *)&script,&this_00->outpoint);
                  COutput::ApplyBumpFee(this_00,*pmVar21);
                }
              }
              std::
              _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
              ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                           *)&script);
            }
            std::
            _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
            ::~_Rb_tree(&trusted_parents._M_t);
            std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
                      (&outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
LAB_0098bdc2:
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              return __return_storage_ptr__;
            }
            __stack_chk_fail();
          }
          wtx = (CWalletTx *)(pwVar25 + 0x28);
          bVar12 = CWallet::IsTxImmatureCoinBase((CWallet *)this,wtx);
        } while ((bVar12) && (*(char *)((long)plVar24 + 0x21) == '\0'));
        depth = CWallet::GetTxDepthInMainChain((CWallet *)this,wtx);
      } while ((depth < 0) || ((depth == 0 && (bVar12 = CWalletTx::InMempool(wtx), !bVar12))));
      local_25c = CachedTxIsTrusted((CWallet *)this,wtx,&trusted_parents);
      if (depth == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&script,"replaces_txid",(allocator<char> *)&outpoint);
        sVar17 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)wtx,(key_type *)&script);
        std::__cxx11::string::~string((string *)&script);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&script,"replaced_by_txid",(allocator<char> *)&outpoint);
        sVar18 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)wtx,(key_type *)&script);
        std::__cxx11::string::~string((string *)&script);
        local_25c = local_25c && (sVar18 == 0 && sVar17 == 0);
      }
    } while (((cVar7 == '\0' && local_25c == false) || (depth < local_228)) || (local_22c < depth));
    script.super_CScriptBase._union._0_4_ = 3;
    bVar12 = CachedTxIsFromMe((CWallet *)this,wtx,(isminefilter *)&script);
    uVar27 = 0;
    while( true ) {
      uVar26 = (uint32_t)uVar27;
      lVar3 = *(long *)(*(long *)(pwVar25 + 0x1c0) + 0x18);
      if ((ulong)((*(long *)(*(long *)(pwVar25 + 0x1c0) + 0x20) - lVar3) / 0x28) <= uVar27) break;
      outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(pwVar25 + 8);
      outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)(pwVar25 + 0x10);
      outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)(pwVar25 + 0x18);
      outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)(pwVar25 + 0x20);
      lVar4 = *(long *)(lVar3 + uVar27 * 0x28);
      outpoint.n = uVar26;
      if (((((*plVar24 <= lVar4) && (lVar4 <= plVar24[1])) &&
           ((!bVar10 ||
            ((bVar13 = CCoinControl::HasSelected((CCoinControl *)wallet), !bVar13 ||
             (bVar13 = CCoinControl::IsSelected((CCoinControl *)wallet,&outpoint), !bVar13)))))) &&
          ((bVar13 = CWallet::IsLockedCoin((CWallet *)this,&outpoint), !bVar13 ||
           (*(char *)((long)plVar24 + 0x22) == '\0')))) &&
         (bVar13 = CWallet::IsSpent((CWallet *)this,&outpoint), !bVar13)) {
        txout = (CTxOut *)(lVar3 + uVar27 * 0x28);
        iVar14 = CWallet::IsMine((CWallet *)this,txout);
        if ((iVar14 != ISMINE_NO) &&
           ((bVar11 != 0 ||
            (bVar13 = CWallet::IsSpentKey((CWallet *)this,&txout->scriptPubKey), !bVar13)))) {
          CWallet::GetSolvingProvider((CWallet *)local_1e0,(CScript *)this);
          local_c8._M_left = (_Base_ptr)0x0;
          local_c8._M_right = (_Base_ptr)0x0;
          local_c8._M_color = _S_red;
          local_c8._4_4_ = 0;
          local_c8._M_parent = (_Base_ptr)0x0;
          outpoint_00.n = local_a8;
          outpoint_00.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
               (uint256)(uint256)ZEXT832(0);
          input_bytes = CalculateMaximumSignedInputSize
                                  (txout,outpoint_00,(SigningProvider *)local_1e0,can_grind_r,
                                   (CCoinControl *)wallet);
          bVar13 = true;
          if (((iVar14 & ISMINE_SPENDABLE) != ISMINE_NO) ||
             (((bVar10 && (iVar14 & ISMINE_WATCH_ONLY) != ISMINE_NO && (-1 < input_bytes)) &&
              (*(char *)((long)&(wallet->m_best_block_time).super___atomic_base<long>._M_i + 2) !=
               '\0')))) {
LAB_0098ba79:
            script_solutions.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            script_solutions.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            script_solutions.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            TVar15 = Solver(&txout->scriptPubKey,&script_solutions);
            auVar8 = local_1e0;
            bVar28 = TVar15 == SCRIPTHASH;
            if (bVar28 && -1 < input_bytes) {
              script.super_CScriptBase._union._16_8_ = 0;
              script.super_CScriptBase._24_8_ = 0;
              script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
              script.super_CScriptBase._union._8_8_ = 0;
              puVar5 = ((script_solutions.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              vch.m_size = (long)((script_solutions.
                                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
              vch.m_data = puVar5;
              base_blob<160U>::base_blob(&local_fc,vch);
              local_d8._0_1_ = local_fc.m_data._M_elems[0x10];
              local_d8._1_1_ = local_fc.m_data._M_elems[0x11];
              local_d8._2_1_ = local_fc.m_data._M_elems[0x12];
              local_d8._3_1_ = local_fc.m_data._M_elems[0x13];
              local_e8[0] = local_fc.m_data._M_elems[0];
              local_e8[1] = local_fc.m_data._M_elems[1];
              local_e8[2] = local_fc.m_data._M_elems[2];
              local_e8[3] = local_fc.m_data._M_elems[3];
              auStack_e4[0] = local_fc.m_data._M_elems[4];
              auStack_e4[1] = local_fc.m_data._M_elems[5];
              auStack_e4[2] = local_fc.m_data._M_elems[6];
              auStack_e4[3] = local_fc.m_data._M_elems[7];
              auStack_e0[0] = local_fc.m_data._M_elems[8];
              auStack_e0[1] = local_fc.m_data._M_elems[9];
              auStack_e0[2] = local_fc.m_data._M_elems[10];
              auStack_e0[3] = local_fc.m_data._M_elems[0xb];
              auStack_dc[0] = local_fc.m_data._M_elems[0xc];
              auStack_dc[1] = local_fc.m_data._M_elems[0xd];
              auStack_dc[2] = local_fc.m_data._M_elems[0xe];
              auStack_dc[3] = local_fc.m_data._M_elems[0xf];
              iVar16 = (*(*(_func_int ***)auVar8)[2])(auVar8,local_e8,&script);
              TVar15 = SCRIPTHASH;
              local_220 = 6;
              if ((char)iVar16 != '\0') {
                TVar15 = Solver(&script,&script_solutions);
                local_220 = 0;
              }
              prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                        (&script.super_CScriptBase);
              bVar9 = bVar23;
              if ((char)iVar16 != '\0') goto LAB_0098bb84;
            }
            else {
LAB_0098bb84:
              if (TVar15 - PUBKEYHASH < 2) {
                type = LEGACY;
              }
              else if (TVar15 - WITNESS_V0_SCRIPTHASH < 2) {
                type = BECH32 - (bVar28 && -1 < input_bytes);
              }
              else {
                type = BECH32M;
                if (TVar15 != WITNESS_V1_TAPROOT) {
                  type = UNKNOWN;
                }
              }
              time = CWalletTx::GetTxTime(wtx);
              feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
              super__Optional_payload_base<CFeeRate>._9_7_ =
                   feerate_local.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                   super__Optional_payload_base<CFeeRate>._9_7_;
              feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
              super__Optional_payload_base<CFeeRate>._M_engaged =
                   feerate_local.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                   super__Optional_payload_base<CFeeRate>._M_engaged;
              feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
              super__Optional_payload_base<CFeeRate>._M_payload =
                   feerate_local.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                   super__Optional_payload_base<CFeeRate>._M_payload;
              COutput::COutput((COutput *)&script,&outpoint,txout,depth,input_bytes,bVar13,
                               (bool)((byte)~(byte)((uint)input_bytes >> 0x18) >> 7),local_25c,time,
                               bVar12,feerate_00);
              CoinsResult::Add(__return_storage_ptr__,type,(COutput *)&script);
              prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(local_158);
              std::vector<COutPoint,_std::allocator<COutPoint>_>::push_back(&outpoints,&outpoint);
              bVar9 = true;
              if ((plVar24[2] == 2100000000000000) ||
                 (__return_storage_ptr__->total_amount < plVar24[2])) {
                uVar27 = plVar24[3];
                if (uVar27 != 0) {
                  sVar19 = CoinsResult::Size(__return_storage_ptr__);
                  local_220 = 1;
                  if (uVar27 <= sVar19) goto LAB_0098bcb1;
                }
                local_220 = 0;
                bVar9 = bVar23;
              }
              else {
                local_220 = 1;
              }
            }
LAB_0098bcb1:
            bVar23 = bVar9;
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector(&script_solutions);
          }
          else {
            if ((char)plVar24[4] == '\0') {
              bVar13 = false;
              goto LAB_0098ba79;
            }
            local_220 = 6;
          }
          if (local_1e0 != (undefined1  [8])0x0) {
            (*(*(_func_int ***)local_1e0)[1])();
          }
          switch(local_220) {
          case 0:
          case 6:
            break;
          default:
            std::
            _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
            ::~_Rb_tree(&trusted_parents._M_t);
            std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
                      (&outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
            if (!bVar23) {
              std::
              _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                           *)__return_storage_ptr__);
            }
            goto LAB_0098bdc2;
          case 2:
            goto switchD_0098bcf7_caseD_2;
          case 3:
            goto switchD_0098bcf7_caseD_3;
          }
        }
      }
      uVar27 = (ulong)(uVar26 + 1);
    }
  } while( true );
}

Assistant:

CoinsResult AvailableCoins(const CWallet& wallet,
                           const CCoinControl* coinControl,
                           std::optional<CFeeRate> feerate,
                           const CoinFilterParams& params)
{
    AssertLockHeld(wallet.cs_wallet);

    CoinsResult result;
    // Either the WALLET_FLAG_AVOID_REUSE flag is not set (in which case we always allow), or we default to avoiding, and only in the case where
    // a coin control object is provided, and has the avoid address reuse flag set to false, do we allow already used addresses
    bool allow_used_addresses = !wallet.IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE) || (coinControl && !coinControl->m_avoid_address_reuse);
    const int min_depth = {coinControl ? coinControl->m_min_depth : DEFAULT_MIN_DEPTH};
    const int max_depth = {coinControl ? coinControl->m_max_depth : DEFAULT_MAX_DEPTH};
    const bool only_safe = {coinControl ? !coinControl->m_include_unsafe_inputs : true};
    const bool can_grind_r = wallet.CanGrindR();
    std::vector<COutPoint> outpoints;

    std::set<uint256> trusted_parents;
    for (const auto& entry : wallet.mapWallet)
    {
        const uint256& txid = entry.first;
        const CWalletTx& wtx = entry.second;

        if (wallet.IsTxImmatureCoinBase(wtx) && !params.include_immature_coinbase)
            continue;

        int nDepth = wallet.GetTxDepthInMainChain(wtx);
        if (nDepth < 0)
            continue;

        // We should not consider coins which aren't at least in our mempool
        // It's possible for these to be conflicted via ancestors which we may never be able to detect
        if (nDepth == 0 && !wtx.InMempool())
            continue;

        bool safeTx = CachedTxIsTrusted(wallet, wtx, trusted_parents);

        // We should not consider coins from transactions that are replacing
        // other transactions.
        //
        // Example: There is a transaction A which is replaced by bumpfee
        // transaction B. In this case, we want to prevent creation of
        // a transaction B' which spends an output of B.
        //
        // Reason: If transaction A were initially confirmed, transactions B
        // and B' would no longer be valid, so the user would have to create
        // a new transaction C to replace B'. However, in the case of a
        // one-block reorg, transactions B' and C might BOTH be accepted,
        // when the user only wanted one of them. Specifically, there could
        // be a 1-block reorg away from the chain where transactions A and C
        // were accepted to another chain where B, B', and C were all
        // accepted.
        if (nDepth == 0 && wtx.mapValue.count("replaces_txid")) {
            safeTx = false;
        }

        // Similarly, we should not consider coins from transactions that
        // have been replaced. In the example above, we would want to prevent
        // creation of a transaction A' spending an output of A, because if
        // transaction B were initially confirmed, conflicting with A and
        // A', we wouldn't want to the user to create a transaction D
        // intending to replace A', but potentially resulting in a scenario
        // where A, A', and D could all be accepted (instead of just B and
        // D, or just A and A' like the user would want).
        if (nDepth == 0 && wtx.mapValue.count("replaced_by_txid")) {
            safeTx = false;
        }

        if (only_safe && !safeTx) {
            continue;
        }

        if (nDepth < min_depth || nDepth > max_depth) {
            continue;
        }

        bool tx_from_me = CachedTxIsFromMe(wallet, wtx, ISMINE_ALL);

        for (unsigned int i = 0; i < wtx.tx->vout.size(); i++) {
            const CTxOut& output = wtx.tx->vout[i];
            const COutPoint outpoint(Txid::FromUint256(txid), i);

            if (output.nValue < params.min_amount || output.nValue > params.max_amount)
                continue;

            // Skip manually selected coins (the caller can fetch them directly)
            if (coinControl && coinControl->HasSelected() && coinControl->IsSelected(outpoint))
                continue;

            if (wallet.IsLockedCoin(outpoint) && params.skip_locked)
                continue;

            if (wallet.IsSpent(outpoint))
                continue;

            isminetype mine = wallet.IsMine(output);

            if (mine == ISMINE_NO) {
                continue;
            }

            if (!allow_used_addresses && wallet.IsSpentKey(output.scriptPubKey)) {
                continue;
            }

            std::unique_ptr<SigningProvider> provider = wallet.GetSolvingProvider(output.scriptPubKey);

            int input_bytes = CalculateMaximumSignedInputSize(output, COutPoint(), provider.get(), can_grind_r, coinControl);
            // Because CalculateMaximumSignedInputSize infers a solvable descriptor to get the satisfaction size,
            // it is safe to assume that this input is solvable if input_bytes is greater than -1.
            bool solvable = input_bytes > -1;
            bool spendable = ((mine & ISMINE_SPENDABLE) != ISMINE_NO) || (((mine & ISMINE_WATCH_ONLY) != ISMINE_NO) && (coinControl && coinControl->fAllowWatchOnly && solvable));

            // Filter by spendable outputs only
            if (!spendable && params.only_spendable) continue;

            // Obtain script type
            std::vector<std::vector<uint8_t>> script_solutions;
            TxoutType type = Solver(output.scriptPubKey, script_solutions);

            // If the output is P2SH and solvable, we want to know if it is
            // a P2SH (legacy) or one of P2SH-P2WPKH, P2SH-P2WSH (P2SH-Segwit). We can determine
            // this from the redeemScript. If the output is not solvable, it will be classified
            // as a P2SH (legacy), since we have no way of knowing otherwise without the redeemScript
            bool is_from_p2sh{false};
            if (type == TxoutType::SCRIPTHASH && solvable) {
                CScript script;
                if (!provider->GetCScript(CScriptID(uint160(script_solutions[0])), script)) continue;
                type = Solver(script, script_solutions);
                is_from_p2sh = true;
            }

            result.Add(GetOutputType(type, is_from_p2sh),
                       COutput(outpoint, output, nDepth, input_bytes, spendable, solvable, safeTx, wtx.GetTxTime(), tx_from_me, feerate));

            outpoints.push_back(outpoint);

            // Checks the sum amount of all UTXO's.
            if (params.min_sum_amount != MAX_MONEY) {
                if (result.GetTotalAmount() >= params.min_sum_amount) {
                    return result;
                }
            }

            // Checks the maximum number of UTXO's.
            if (params.max_count > 0 && result.Size() >= params.max_count) {
                return result;
            }
        }
    }

    if (feerate.has_value()) {
        std::map<COutPoint, CAmount> map_of_bump_fees = wallet.chain().calculateIndividualBumpFees(outpoints, feerate.value());

        for (auto& [_, outputs] : result.coins) {
            for (auto& output : outputs) {
                output.ApplyBumpFee(map_of_bump_fees.at(output.outpoint));
            }
        }
    }

    return result;
}